

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::Desc::Desc(Desc *this,Desc *old)

{
  long in_RSI;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *in_RDI;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *old_00;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *in_stack_ffffffffffffffe0;
  
  old_00 = in_RDI;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray(in_stack_ffffffffffffffe0,in_RDI)
  ;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status>::DataArray(in_stack_ffffffffffffffe0,old_00)
  ;
  if (*(long *)(in_RSI + 0x30) == in_RSI) {
    *(DataArray<soplex::SPxBasisBase<double>::Desc::Status> **)(in_RDI + 2) = in_RDI;
    in_RDI[2].data = &in_RDI[1].thesize;
  }
  else {
    *(DataArray<soplex::SPxBasisBase<double>::Desc::Status> **)(in_RDI + 2) = in_RDI + 1;
    in_RDI[2].data = &in_RDI->thesize;
  }
  return;
}

Assistant:

SPxBasisBase<R>::Desc::Desc(const Desc& old)
   : rowstat(old.rowstat)
   , colstat(old.colstat)
{
   if(old.stat == &old.rowstat)
   {
      assert(old.costat == &old.colstat);

      stat   = &rowstat;
      costat = &colstat;
   }
   else
   {
      assert(old.costat == &old.rowstat);

      stat   = &colstat;
      costat = &rowstat;
   }

   assert(Desc::isConsistent());
}